

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall MyPlanner::MyPlanner(MyPlanner *this)

{
  char *__end;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"TRIVIAL","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"TRIVIAL","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TRIVIAL","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"TRIVIAL","");
  despot::Planner::Planner(&this->super_Planner,local_48,local_68,local_88,local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  *(undefined ***)this = &PTR__Planner_00113cf0;
  return;
}

Assistant:

MyPlanner() {
	}